

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O1

int wally_addr_segwit_n_to_bytes
              (char *addr,size_t addr_len,char *addr_family,size_t addr_family_len,uint32_t flags,
              uchar *bytes_out,size_t len,size_t *written)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  uint unaff_EBX;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  size_t sVar15;
  bool bVar16;
  uchar decoded [40];
  uint8_t data [84];
  uchar local_118 [48];
  char local_e8 [96];
  byte local_88 [88];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  sVar14 = 0xfffffffe;
  if (((((written == (size_t *)0x0) || (len == 0)) || (bytes_out == (uchar *)0x0)) ||
      ((addr_len < 8 || (addr == (char *)0x0)))) ||
     ((addr_family_len == 0 || ((addr_family == (char *)0x0 || (flags != 0)))))) goto LAB_0014d308;
  bVar3 = true;
  if (addr_len - 0x5b < 0xffffffffffffffad) {
    bVar16 = false;
  }
  else {
    pcVar7 = addr + -1;
    sVar15 = 0;
    do {
      sVar14 = sVar15;
      if (pcVar7[addr_len] == '1') break;
      sVar15 = sVar15 + 1;
      pcVar7 = pcVar7 + -1;
      sVar14 = addr_len;
    } while (addr_len != sVar15);
    uVar1 = sVar14 + 1;
    uVar10 = addr_len - uVar1;
    bVar16 = false;
    if (sVar14 < 6 || (addr_len < uVar1 || uVar10 == 0)) {
      bVar16 = false;
    }
    else {
      sVar14 = sVar14 - 6;
      uVar13 = uVar10 + (uVar10 == 0);
      bVar3 = false;
      uVar6 = 1;
      uVar12 = 0;
      do {
        uVar11 = uVar12;
        cVar2 = addr[uVar11];
        unaff_EBX = (uint)cVar2;
        if ((byte)(cVar2 - 0x21U) < 0x5e) {
          if ((byte)(cVar2 + 0x9fU) < 0x1a) {
            bVar3 = true;
          }
          else if ((byte)(cVar2 + 0xbfU) < 0x1a) {
            bVar16 = true;
            unaff_EBX = unaff_EBX | 0x20;
          }
          local_e8[uVar11] = (char)unaff_EBX;
          uVar4 = bech32_polymod_step(uVar6);
          uVar6 = unaff_EBX >> 5 ^ uVar4;
          unaff_EBX = uVar6;
        }
        uVar9 = (ulong)unaff_EBX;
        if (0x5d < (byte)(cVar2 - 0x21U)) goto LAB_0014d25f;
        uVar12 = uVar11 + 1;
      } while (uVar13 != uVar11 + 1);
      local_e8[uVar11 + 1] = '\0';
      uVar4 = bech32_polymod_step(uVar6);
      uVar12 = 1;
      if (addr_len != uVar1) {
        uVar9 = 0;
        do {
          uVar4 = bech32_polymod_step(uVar4);
          uVar4 = (byte)addr[uVar9] & 0x1f ^ uVar4;
          uVar9 = uVar9 + 1;
        } while (uVar13 != uVar9);
        uVar12 = uVar13 + 1;
      }
      do {
        unaff_EBX = (uint)uVar9;
        if (addr_len <= uVar12) {
          if ((bVar3) && (bVar16)) goto LAB_0014d25f;
          bVar16 = uVar4 == 0x2bc830a3;
          bVar3 = uVar4 != 1 && !bVar16;
          goto LAB_0014d261;
        }
        cVar2 = addr[uVar12];
        if ((long)cVar2 < 0) {
          uVar9 = 0xffffffff;
        }
        else {
          uVar9 = (ulong)(uint)(int)charset_rev[cVar2];
        }
        uVar6 = (uint)uVar9;
        if ((byte)(cVar2 + 0x9fU) < 0x1a) {
          bVar3 = true;
        }
        if ((byte)(cVar2 + 0xbfU) < 0x1a) {
          bVar16 = true;
        }
        if (uVar6 != 0xffffffff) {
          uVar4 = bech32_polymod_step(uVar4);
          if (uVar12 + 6 < addr_len) {
            local_88[uVar12 + ~uVar10] = (byte)uVar9;
          }
          uVar4 = uVar4 ^ uVar6;
          uVar12 = uVar12 + 1;
        }
      } while (uVar6 != 0xffffffff);
      unaff_EBX = 0xffffffff;
LAB_0014d25f:
      bVar16 = false;
      bVar3 = true;
    }
  }
LAB_0014d261:
  if ((((bVar3) || (sVar14 - 0x42 < 0xffffffffffffffbf)) ||
      (sVar8 = strlen(local_e8), sVar8 != addr_family_len)) ||
     (iVar5 = bcmp(local_e8,addr_family,addr_family_len), iVar5 != 0)) {
LAB_0014d29e:
    uVar6 = unaff_EBX;
    wally_clear_2(local_88,0x54,local_e8,0x54);
    bVar3 = true;
  }
  else {
    unaff_EBX = (uint)local_88[0];
    uVar6 = (uint)local_88[0];
    if (local_88[0] == 0) {
      if (!bVar16) goto LAB_0014d346;
      goto LAB_0014d29e;
    }
    if (!bVar16 || 0x10 < local_88[0]) goto LAB_0014d29e;
LAB_0014d346:
    *written = 0;
    iVar5 = convert_bits(local_118,written,8,(uint8_t *)((long)local_88 + 1),sVar14 - 1,5,0);
    if (((iVar5 == 0) || (sVar14 = *written, sVar14 - 0x29 < 0xffffffffffffffd9)) ||
       ((bVar3 = false, local_88[0] == 0 && ((sVar14 != 0x14 && (sVar14 != 0x20))))))
    goto LAB_0014d29e;
  }
  if (bVar3) {
    *written = 0;
    sVar14 = 0xfffffffe;
  }
  else {
    uVar6 = wally_witness_program_from_bytes_and_version
                      (local_118,*written,uVar6 & 0xff,0,bytes_out,len,written);
    sVar14 = (size_t)uVar6;
  }
  wally_clear(local_118,0x28);
LAB_0014d308:
  return (int)sVar14;
}

Assistant:

int wally_addr_segwit_n_to_bytes(const char *addr, size_t addr_len,
                                 const char *addr_family, size_t addr_family_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char decoded[40];
    int ret;
    uint8_t witver;

    if (written)
        *written = 0;

    if (flags || !addr_family || !addr_family_len || !addr || addr_len < 8 || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (!segwit_addr_decode(&witver, decoded, written, addr_family, addr_family_len, addr, addr_len)) {
        *written = 0;
        ret = WALLY_EINVAL;
    } else {
        ret = wally_witness_program_from_bytes_and_version(
            decoded, *written, witver, flags, bytes_out, len, written);
    }

    wally_clear(decoded, sizeof(decoded));
    return ret;
}